

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawPanelItemViewItem
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *widget)

{
  Int IVar1;
  int iVar2;
  QPixmapStylePrivate *r;
  QPainter *in_RCX;
  long in_RSI;
  QPainter *in_RDI;
  long in_FS_OFFSET;
  ControlDescriptor cd;
  QPixmapStylePrivate *d;
  QRect rect;
  QPixmap pix;
  ControlPixmap cp;
  undefined4 in_stack_ffffffffffffff28;
  StateFlag in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff48;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined4 uVar6;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_84;
  undefined8 local_80;
  undefined8 local_78;
  ControlDescriptor in_stack_ffffffffffffff9c;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined4 local_2c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r = d_func((QPixmapStyle *)0x3ff57f);
  local_2c = 0x16;
  uVar6 = 0x22;
  bVar5 = 0;
  bVar3 = 0;
  if (in_RCX != (QPainter *)0x0) {
    QObject::property((char *)&local_28);
    bVar5 = 1;
    bVar3 = ::QVariant::toBool();
  }
  bVar4 = bVar3;
  if ((bVar5 & 1) != 0) {
    ::QVariant::~QVariant(&local_28);
  }
  if ((bVar3 & 1) != 0) {
    local_2c = 0x15;
    uVar6 = 0x21;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            ((QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)
             CONCAT44(uVar6,CONCAT13(bVar5,CONCAT12(bVar4,in_stack_ffffffffffffff48))),
             (ControlPixmap *)in_RDI);
  QPixmap::QPixmap((QPixmap *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (QPixmap *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QPixmapStylePixmap::~QPixmapStylePixmap((QPixmapStylePixmap *)0x3ff67e);
  local_80 = *(undefined8 *)(in_RSI + 0x10);
  local_78 = *(undefined8 *)(in_RSI + 0x18);
  QRect::top((QRect *)0x3ff6b7);
  QPixmap::height();
  QRect::setBottom((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff2c);
  QPainter::drawPixmap
            (in_RCX,(QRect *)r,
             (QPixmap *)CONCAT44(uVar6,CONCAT13(bVar5,CONCAT12(bVar4,in_stack_ffffffffffffff48))));
  local_84.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)
                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
  if (IVar1 != 0) {
    local_80 = *(undefined8 *)(in_RSI + 0x10);
    local_78 = *(undefined8 *)(in_RSI + 0x18);
    iVar2 = QRect::top((QRect *)0x3ff739);
    QPixmap::height();
    QRect::setTop((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c);
    drawCachedPixmap((QPixmapStyle *)r,in_stack_ffffffffffffff9c,
                     (QRect *)CONCAT44(uVar6,CONCAT13(bVar5,CONCAT12(bVar4,in_stack_ffffffffffffff48
                                                                    ))),in_RDI);
  }
  QPixmap::~QPixmap((QPixmap *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapStyle::drawPanelItemViewItem(const QStyleOption *option, QPainter *painter,
                                         const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    ControlPixmap cp = ID_Separator;
    ControlDescriptor cd = ID_Selected;

    if (widget && widget->property("_pixmap_combobox_list").toBool()) {
        cp = DD_ItemSeparator;
        cd = DD_ItemSelected;
    }

    QPixmap pix = d->pixmaps.value(cp).pixmap;
    QRect rect = option->rect;
    rect.setBottom(rect.top() + pix.height()-1);
    painter->drawPixmap(rect, pix);
    if (option->state & QStyle::State_Selected) {
        rect = option->rect;
        rect.setTop(rect.top() + pix.height());
        drawCachedPixmap(cd, rect, painter);
    }
}